

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1e006::
ARTScanTest_scanRangeReverseTwoLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTScanTest_scanRangeReverseTwoLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  int iVar1;
  void *extraout_RDX_00;
  void *pvVar2;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  stack_entry *psVar3;
  value_view v_00;
  value_view v_01;
  bool match;
  art_key_type from_key_;
  art_key_type to_key_;
  uint64_t n;
  visitor_type v;
  iterator it;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  bool local_6c1;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_6c0;
  anon_class_16_2_811f47a5 local_6b8;
  undefined8 local_6a8;
  vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  local_6a0;
  unsigned_long local_680;
  visitor<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator>
  local_678;
  iterator local_670;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  void *extraout_RDX;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  v_00._M_extent._M_extent_value = 1;
  v_00._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal(&local_500,1,v_00,false);
  v_01._M_extent._M_extent_value = 2;
  v_01._M_ptr = (pointer)&unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal(&local_500,2,v_01,false);
  local_6b8.n = &local_680;
  local_680 = 0;
  local_6b8.visited = &local_6a0;
  local_6a0.
  super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a0.
  super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a0.
  super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c0.key = 0x200000000000000;
  local_6a8 = 0;
  iVar1 = unodb::detail::basic_art_key<unsigned_long>::cmp
                    ((basic_art_key<unsigned_long> *)&local_6c0.key_bytes,(void *)0x0,extraout_RDX);
  if (iVar1 != 0) {
    local_6c1 = false;
    local_678.it = &local_670;
    if (iVar1 < 0) {
      unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
      iterator(&local_670,&local_500.test_db);
      unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
      seek(&local_670,(art_key_type)local_6c0.key_bytes._M_elems,&local_6c1,true);
      pvVar2 = extraout_RDX_02;
      while (local_670.stack_.c.
             super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_670.stack_.c.
             super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        iVar1 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                iterator::cmp(&local_670,&local_6a8,pvVar2);
        if (-1 < iVar1) break;
        TestBody::anon_class_16_2_811f47a5::operator()(&local_6b8,&local_678);
        unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator
        ::next(&local_670);
        pvVar2 = extraout_RDX_03;
      }
    }
    else {
      unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
      iterator(&local_670,&local_500.test_db);
      unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
      seek(&local_670,(art_key_type)local_6c0.key_bytes._M_elems,&local_6c1,false);
      pvVar2 = extraout_RDX_00;
      while (local_670.stack_.c.
             super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_670.stack_.c.
             super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        iVar1 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                iterator::cmp(&local_670,&local_6a8,pvVar2);
        if (iVar1 < 1) break;
        TestBody::anon_class_16_2_811f47a5::operator()(&local_6b8,&local_678);
        unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator
        ::prior(&local_670);
        pvVar2 = extraout_RDX_01;
      }
    }
    unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
    ~iterator(&local_670);
  }
  local_6b8.n = (uint64_t *)CONCAT44(local_6b8.n._4_4_,2);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_670,"(2)","(n)",(int *)&local_6b8,&local_680);
  if ((char)local_670.db_ == '\0') {
    testing::Message::Message((Message *)&local_6b8);
    if (local_670.stack_.c.
        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_map == (_Map_pointer)0x0) {
      psVar3 = (stack_entry *)0x1fb8df;
    }
    else {
      psVar3 = *local_670.stack_.c.
                super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_map;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6c0.key_bytes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2cd,(char *)psVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_6c0.key_bytes,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6c0.key_bytes);
    if (local_6b8.n != (uint64_t *)0x0) {
      (**(code **)(*local_6b8.n + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_670.stack_);
  local_6c0.key._0_4_ = 2;
  local_6b8.n = (uint64_t *)
                (((long)local_6a0.
                        super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_6a0.
                       super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_670,"(2)","(visited.size())",(int *)&local_6c0.key,
             (unsigned_long *)&local_6b8);
  if ((char)local_670.db_ == '\0') {
    testing::Message::Message((Message *)&local_6b8);
    if (local_670.stack_.c.
        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_map == (_Map_pointer)0x0) {
      psVar3 = (stack_entry *)0x1fb8df;
    }
    else {
      psVar3 = *local_670.stack_.c.
                super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_map;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6c0.key_bytes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2ce,(char *)psVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_6c0.key_bytes,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6c0.key_bytes);
    if (local_6b8.n != (uint64_t *)0x0) {
      (**(code **)(*local_6b8.n + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_670.stack_);
  local_6b8.n = (uint64_t *)CONCAT44(local_6b8.n._4_4_,2);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_670,"(2)","(visited[0].first)",(int *)&local_6b8,
             &(local_6a0.
               super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first);
  if ((char)local_670.db_ == '\0') {
    testing::Message::Message((Message *)&local_6b8);
    if (local_670.stack_.c.
        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_map == (_Map_pointer)0x0) {
      psVar3 = (stack_entry *)0x1fb8df;
    }
    else {
      psVar3 = *local_670.stack_.c.
                super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_map;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6c0.key_bytes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2cf,(char *)psVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_6c0.key_bytes,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6c0.key_bytes);
    if (local_6b8.n != (uint64_t *)0x0) {
      (**(code **)(*local_6b8.n + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_670.stack_);
  local_6b8.n = (uint64_t *)CONCAT44(local_6b8.n._4_4_,1);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_670,"(1)","(visited[1].first)",(int *)&local_6b8,
             &local_6a0.
              super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].first);
  if ((char)local_670.db_ == '\0') {
    testing::Message::Message((Message *)&local_6b8);
    if (local_670.stack_.c.
        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_map == (_Map_pointer)0x0) {
      psVar3 = (stack_entry *)0x1fb8df;
    }
    else {
      psVar3 = *local_670.stack_.c.
                super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_map;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6c0.key_bytes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2d0,(char *)psVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_6c0.key_bytes,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6c0.key_bytes);
    if (local_6b8.n != (uint64_t *)0x0) {
      (**(code **)(*local_6b8.n + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_670.stack_);
  std::
  vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ::~vector(&local_6a0);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanRangeReverseTwoLeaves) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(1, unodb::test::test_values[0]);
  verifier.insert(2, unodb::test::test_values[1]);
  uint64_t n = 0;
  std::vector<std::pair<std::uint64_t, typename TypeParam::value_view>>
      visited{};
  auto fn = [&n,
             &visited](const unodb::visitor<typename TypeParam::iterator>& v) {
    n++;
    visited.emplace_back(decode(v.get_key()), v.get_value());
    return false;
  };
  db.scan_range(2, 0, fn);
  UNODB_EXPECT_EQ(2, n);
  UNODB_EXPECT_EQ(2, visited.size());
  UNODB_EXPECT_EQ(2, visited[0].first);  // make sure visited in reverse order.
  UNODB_EXPECT_EQ(1, visited[1].first);
}